

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcasestr.c
# Opt level: O2

char * nn_strcasestr(char *str,char *key)

{
  int iVar1;
  size_t len;
  
  len = strlen(key);
  while( true ) {
    if (*str == '\0') {
      return (char *)0x0;
    }
    iVar1 = nn_strncasecmp(str,key,len);
    if (iVar1 == 0) break;
    str = str + 1;
  }
  return str;
}

Assistant:

const char *
nn_strcasestr(const char *str, const char *key)
{
	size_t len = strlen(key);

	while (*str != '\0') {
		if (nn_strncasecmp(str, key, len) == 0) {
			return str;
		}
		str++;
	}
	return (NULL);
}